

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<unsigned_int,int>
          (char *expected_expression,char *actual_expression,uint *expected,int *actual)

{
  int *in_RCX;
  uint *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  internal *in_RDI;
  int *in_R8;
  AssertionResult AVar2;
  internal *this;
  string local_68;
  string local_48 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (*in_RCX == *in_R8) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    this = in_RDI;
    FormatForComparisonFailureMessage<unsigned_int,int>((uint *)in_RDI,(int *)in_RDX);
    FormatForComparisonFailureMessage<int,unsigned_int>((int *)this,in_RDX);
    EqFailure(this,in_RSI,(char *)in_RDX,local_48,&local_68,false);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}